

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Session SStack_1a8;
  
  std::operator<<((ostream *)&std::cout,"macros defined:\n");
  Catch::Session::Session(&SStack_1a8);
  iVar1 = Catch::Session::run<char>(&SStack_1a8,argc,argv);
  Catch::Session::~Session(&SStack_1a8);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    std::cout << "macros defined:\n";
#ifdef _WIN32
    std::cout << "_WIN32 defined\n";
#endif

#ifdef __CYGWIN__
    std::cout << "__CYGWIN__ defined\n";
#endif

#ifdef __APPLE__
    std::cout << "__APPLE__ defined\n";
#endif

    // your existing setup...
    int result = Catch::Session().run(argc, argv);

    // your existing clean-up...
    return result;
}